

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::DriverVisitor,_true,_true>::
visitDefault<slang::ast::WhileLoopStatement>
          (ASTVisitor<slang::ast::DriverVisitor,_true,_true> *this,WhileLoopStatement *t)

{
  WhileLoopStatement *t_local;
  ASTVisitor<slang::ast::DriverVisitor,_true,_true> *this_local;
  
  WhileLoopStatement::visitExprs<slang::ast::DriverVisitor&>(t,(DriverVisitor *)this);
  WhileLoopStatement::visitStmts<slang::ast::DriverVisitor&>(t,(DriverVisitor *)this);
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && is_detected_v<visitExprs_t, T, TDerived>) {
            t.visitExprs(DERIVED);
        }

        if constexpr (VisitStatements && is_detected_v<visitStmts_t, T, TDerived>) {
            t.visitStmts(DERIVED);
        }

        if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }